

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwTestNow(char *file,int line,int always_invoked)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char *data;
  mwData *mw;
  int local_20;
  int retv;
  int always_invoked_local;
  int line_local;
  char *file_local;
  
  mw._4_4_ = 0;
  if ((file != (char *)0x0) && (always_invoked == 0)) {
    pcVar6 = "";
    if ((mwTestFlags & 1U) != 0) {
      pcVar6 = "chain ";
    }
    pcVar7 = "";
    if ((mwTestFlags & 2U) != 0) {
      pcVar7 = "alloc ";
    }
    pcVar2 = "";
    if ((mwTestFlags & 4U) != 0) {
      pcVar2 = "nomansland ";
    }
    mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",mwCounter,file,(ulong)(uint)line,pcVar6,pcVar7,
            pcVar2);
  }
  local_20 = always_invoked;
  if ((mwTestFlags & 1U) != 0) {
    for (data = (char *)mwHead; data != (char *)0x0; data = *(char **)(data + 8)) {
      iVar1 = mwIsSafeAddr(data,mwDataSize);
      if (iVar1 == 0) {
        if (local_20 != 0) {
          mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,(ulong)(uint)line);
        }
        mwWrite("check: heap corruption detected\n");
        mwIncErr();
        return mw._4_4_ + 1;
      }
      if (*(long *)data != 0) {
        iVar1 = mwIsSafeAddr(*(void **)data,mwDataSize);
        if (iVar1 == 0) {
          if (local_20 != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,(ulong)(uint)line);
          }
          mwWrite("check: heap corruption detected\n");
          mwIncErr();
          return mw._4_4_ + 1;
        }
        if (((mwData *)data == mwHead) || (*(char **)(*(long *)data + 8) != data)) {
          if (local_20 != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,(ulong)(uint)line);
            local_20 = 0;
          }
          mwWrite("check: heap chain broken, prev link incorrect\n");
          mwIncErr();
          mw._4_4_ = mw._4_4_ + 1;
        }
      }
      if (*(long *)(data + 8) == 0) {
        if ((mwData *)data != mwTail) {
          if (local_20 != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,(ulong)(uint)line);
            local_20 = 0;
          }
          mwWrite("check: heap chain broken, tail incorrect\n");
          mwIncErr();
          mw._4_4_ = mw._4_4_ + 1;
        }
      }
      else {
        iVar1 = mwIsSafeAddr(*(void **)(data + 8),mwDataSize);
        if (iVar1 == 0) {
          if (local_20 != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,(ulong)(uint)line);
          }
          mwWrite("check: heap corruption detected\n");
          mwIncErr();
          return mw._4_4_ + 1;
        }
        if (((mwData *)data == mwTail) || ((char *)**(long **)(data + 8) != data)) {
          if (local_20 != 0) {
            mwWrite("autocheck: <%ld> %s(%d) ",mwCounter,file,(ulong)(uint)line);
            local_20 = 0;
          }
          mwWrite("check: heap chain broken, next link incorrect\n");
          mwIncErr();
          mw._4_4_ = mw._4_4_ + 1;
        }
      }
    }
  }
  if ((mwTestFlags & 2U) != 0) {
    for (data = (char *)mwHead; data != (char *)0x0; data = *(char **)(data + 8)) {
      iVar1 = mwTestBuf((mwData *)data,file,line);
      if (iVar1 != 0) {
        mw._4_4_ = mw._4_4_ + 1;
      }
    }
  }
  if ((mwTestFlags & 4U) != 0) {
    for (data = (char *)mwHead; data != (char *)0x0; data = *(char **)(data + 8)) {
      if ((*(uint *)(data + 0x34) & 1) != 0) {
        lVar4 = (long)mwDataSize;
        lVar5 = (long)mwOverflowZoneSize;
        pvVar3 = mwTestMem(data + lVar5 + lVar4,(uint)*(undefined8 *)(data + 0x28),0xfc);
        if (pvVar3 != (void *)0x0) {
          mwIncErr();
          mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",
                  *(undefined8 *)(data + 0x18),data + lVar5 + lVar4 + mwOverflowZoneSize,
                  *(undefined8 *)(data + 0x10),(ulong)*(uint *)(data + 0x30));
        }
      }
    }
  }
  if (((file != (char *)0x0) && (local_20 == 0)) && (mw._4_4_ == 0)) {
    mwWrite("check: <%ld> %s(%d), complete; no errors\n",mwCounter,file,(ulong)(uint)line);
  }
  return mw._4_4_;
}

Assistant:

static int mwTestNow(const char *file, int line, int always_invoked)
{
	int retv = 0;
	mwData *mw;
	char *data;

	if (file && !always_invoked)
		mwWrite("check: <%ld> %s(%d), checking %s%s%s\n",
				mwCounter, file, line,
				(mwTestFlags & MW_TEST_CHAIN) ? "chain " : "",
				(mwTestFlags & MW_TEST_ALLOC) ? "alloc " : "",
				(mwTestFlags & MW_TEST_NML) ? "nomansland " : ""
			   );

	if (mwTestFlags & MW_TEST_CHAIN) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (!mwIsSafeAddr(mw, mwDataSize)) {
				AIPH();
				mwWrite("check: heap corruption detected\n");
				mwIncErr();
				return retv + 1;
			}
			if (mw->prev) {
				if (!mwIsSafeAddr(mw->prev, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwHead || mw->prev->next != mw) {
					AIPH();
					mwWrite("check: heap chain broken, prev link incorrect\n");
					mwIncErr();
					retv ++;
				}
			}
			if (mw->next) {
				if (!mwIsSafeAddr(mw->next, mwDataSize)) {
					AIPH();
					mwWrite("check: heap corruption detected\n");
					mwIncErr();
					return retv + 1;
				}
				if (mw == mwTail || mw->next->prev != mw) {
					AIPH();
					mwWrite("check: heap chain broken, next link incorrect\n");
					mwIncErr();
					retv ++;
				}
			} else if (mw != mwTail) {
				AIPH();
				mwWrite("check: heap chain broken, tail incorrect\n");
				mwIncErr();
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_ALLOC) {
		for (mw = mwHead; mw; mw = mw->next) {
			if (mwTestBuf(mw, file, line)) {
				retv ++;
			}
		}
	}
	if (mwTestFlags & MW_TEST_NML) {
		for (mw = mwHead; mw; mw = mw->next) {
			if ((mw->flag & MW_NML)) {
				data = ((char *)mw) + mwDataSize + mwOverflowZoneSize;
				if (mwTestMem(data, mw->size, MW_VAL_NML)) {
					mwIncErr();
					mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
							mw->count, data + mwOverflowZoneSize, mw->file, mw->line);
				}
			}
		}
	}


	if (file && !always_invoked && !retv)
		mwWrite("check: <%ld> %s(%d), complete; no errors\n",
				mwCounter, file, line);
	return retv;
}